

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_advsound.cpp
# Opt level: O0

bool S_CheckSound(sfxinfo_t *startsfx,sfxinfo_t *sfx,TArray<sfxinfo_t_*,_sfxinfo_t_*> *chain)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  FRandomSoundList *pFVar5;
  sfxinfo_t *psVar6;
  char *pcVar7;
  sfxinfo_t **ppsVar8;
  bool bVar9;
  uint local_58;
  uint local_54;
  uint i_2;
  uint i_1;
  sfxinfo_t *rsfx;
  int i;
  FRandomSoundList *list;
  uint siz;
  bool success;
  sfxinfo_t *me;
  TArray<sfxinfo_t_*,_sfxinfo_t_*> *chain_local;
  sfxinfo_t *sfx_local;
  sfxinfo_t *startsfx_local;
  
  bVar9 = true;
  chain_local = (TArray<sfxinfo_t_*,_sfxinfo_t_*> *)sfx;
  sfx_local = startsfx;
  uVar2 = TArray<sfxinfo_t_*,_sfxinfo_t_*>::Size(chain);
  if ((*(ushort *)&chain_local[3].Array >> 1 & 1) == 0) {
    uVar3 = TArray<sfxinfo_t_*,_sfxinfo_t_*>::Find(chain,(sfxinfo_t **)&chain_local);
    uVar4 = TArray<sfxinfo_t_*,_sfxinfo_t_*>::Size(chain);
    if (uVar3 < uVar4) {
      startsfx_local._7_1_ = true;
    }
    else {
      TArray<sfxinfo_t_*,_sfxinfo_t_*>::Push(chain,(sfxinfo_t **)&chain_local);
      if ((*(ushort *)&sfx->field_0x30 & 1) == 0) {
        if (sfx->link != 0xffffffff) {
          psVar6 = TArray<sfxinfo_t,_sfxinfo_t>::operator[](&S_sfx,(ulong)sfx->link);
          if (psVar6 == sfx_local) {
            pcVar7 = FString::GetChars(&sfx_local->name);
            Printf("\x1cGrecursive sound $alias found for %s:\n",pcVar7);
            bVar9 = false;
            for (local_58 = 1; uVar3 = TArray<sfxinfo_t_*,_sfxinfo_t_*>::Size(chain),
                local_58 < uVar3; local_58 = local_58 + 1) {
              ppsVar8 = TArray<sfxinfo_t_*,_sfxinfo_t_*>::operator[](chain,(ulong)local_58);
              pcVar7 = FString::GetChars(&(*ppsVar8)->name);
              Printf("\x1cI    -> %s\n",pcVar7);
            }
            TArray<sfxinfo_t_*,_sfxinfo_t_*>::Resize(chain,uVar2);
          }
          else {
            bVar9 = S_CheckSound(sfx_local,psVar6,chain);
          }
        }
      }
      else {
        pFVar5 = TArray<FRandomSoundList,_FRandomSoundList>::operator[](&S_rnd,(ulong)sfx->link);
        for (rsfx._4_4_ = 0; rsfx._4_4_ < (int)(uint)pFVar5->NumSounds; rsfx._4_4_ = rsfx._4_4_ + 1)
        {
          psVar6 = TArray<sfxinfo_t,_sfxinfo_t>::operator[]
                             (&S_sfx,(ulong)pFVar5->Sounds[rsfx._4_4_]);
          if (psVar6 == sfx_local) {
            pcVar7 = FString::GetChars(&sfx_local->name);
            Printf("\x1cGrecursive sound $random found for %s:\n",pcVar7);
            bVar9 = false;
            for (local_54 = 1; uVar2 = TArray<sfxinfo_t_*,_sfxinfo_t_*>::Size(chain),
                local_54 < uVar2; local_54 = local_54 + 1) {
              ppsVar8 = TArray<sfxinfo_t_*,_sfxinfo_t_*>::operator[](chain,(ulong)local_54);
              pcVar7 = FString::GetChars(&(*ppsVar8)->name);
              Printf("\x1cI    -> %s\n",pcVar7);
            }
          }
          else {
            bVar1 = S_CheckSound(sfx_local,psVar6,chain);
            bVar9 = (bVar9 & bVar1) != 0;
          }
        }
      }
      TArray<sfxinfo_t_*,_sfxinfo_t_*>::Pop(chain);
      startsfx_local._7_1_ = bVar9;
    }
  }
  else {
    startsfx_local._7_1_ = true;
  }
  return startsfx_local._7_1_;
}

Assistant:

static bool S_CheckSound(sfxinfo_t *startsfx, sfxinfo_t *sfx, TArray<sfxinfo_t *> &chain)
{
	sfxinfo_t *me = sfx;
	bool success = true;
	unsigned siz = chain.Size();

	if (sfx->bPlayerReserve)
	{
		return true;
	}

	// There is a bad link in here, but let's report it only for the sound that contains the broken definition.
	// Once that sound has been disabled this one will work again.
	if (chain.Find(sfx) < chain.Size())
	{
		return true;
	}
	chain.Push(sfx);

	if (me->bRandomHeader)
	{
		const FRandomSoundList *list = &S_rnd[me->link];
		for (int i = 0; i < list->NumSounds; ++i)
		{
			auto rsfx = &S_sfx[list->Sounds[i]];
			if (rsfx == startsfx)
			{
				Printf(TEXTCOLOR_RED "recursive sound $random found for %s:\n", startsfx->name.GetChars());
				success = false;
				for (unsigned i = 1; i<chain.Size(); i++)
				{
					Printf(TEXTCOLOR_ORANGE "    -> %s\n", chain[i]->name.GetChars());
				}
			}
			else
			{
				success &= S_CheckSound(startsfx, rsfx, chain);
			}
		}
	}
	else if (me->link != sfxinfo_t::NO_LINK)
	{
		me = &S_sfx[me->link];
		if (me == startsfx)
		{
			Printf(TEXTCOLOR_RED "recursive sound $alias found for %s:\n", startsfx->name.GetChars());
			success = false;
			for (unsigned i = 1; i<chain.Size(); i++)
			{
				Printf(TEXTCOLOR_ORANGE "    -> %s\n", chain[i]->name.GetChars());
			}
			chain.Resize(siz);
		}
		else
		{
			success &= S_CheckSound(startsfx, me, chain);
		}
	}
	chain.Pop();
	return success;
}